

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

void __thiscall ConfigTest_write_object_Test::TestBody(ConfigTest_write_object_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_1b8 [8];
  Message local_1b0 [8];
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_1a8;
  string local_188 [32];
  object local_168;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_128;
  undefined1 local_108 [8];
  AssertionResult gtest_ar;
  _Variadic_union<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  local_d8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  allocator<char> local_81;
  string local_80;
  path local_60;
  undefined1 local_38 [8];
  path file_path;
  ConfigTest_write_object_Test *this_local;
  
  file_path._32_8_ = this;
  std::filesystem::__cxx11::path::path<char[18],std::filesystem::__cxx11::path>
            (&local_60,(char (*) [18])"write_object.test",auto_format);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"some_data",&local_81);
  make_tmp_file((path *)local_38,&local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::filesystem::__cxx11::path::~path(&local_60);
  local_a8 = 0;
  uStack_a0 = 0;
  local_d8._32_8_ = 0;
  local_d8._40_8_ = 0;
  local_d8._16_8_ = 0;
  local_d8._24_8_ = 0;
  local_d8._M_first._M_storage = (_Uninitialized<void_*,_true>)(void *)0x0;
  local_d8._8_8_ = 0;
  jessilib::object::object((object *)&local_d8._M_first);
  std::__cxx11::string::string((string *)&gtest_ar.message_);
  jessilib::config::write_object
            ((object *)&local_d8._M_first,(path *)local_38,(string *)&gtest_ar.message_,utf_8);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  jessilib::object::~object((object *)&local_d8._M_first);
  std::__cxx11::string::string(local_188);
  jessilib::config::read_object((path *)&local_168,(string *)local_38,(text_encoding)local_188);
  std::__cxx11::u8string::u8string((u8string *)&local_1a8);
  jessilib::object::
  get<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
            (&local_128,&local_168,&local_1a8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_char8_t[17],_nullptr>
            ((EqHelper *)local_108,"config::read_object(file_path).get<std::u8string>()",
             "u8\"serialize_result\"",&local_128,(char8_t (*) [17])"serialize_result");
  std::__cxx11::u8string::~u8string((u8string *)&local_128);
  std::__cxx11::u8string::~u8string((u8string *)&local_1a8);
  jessilib::object::~object(&local_168);
  std::__cxx11::string::~string(local_188);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(local_1b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              (local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/config.cpp"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=(local_1b8,local_1b0);
    testing::internal::AssertHelper::~AssertHelper(local_1b8);
    testing::Message::~Message(local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  std::filesystem::__cxx11::path::~path((path *)local_38);
  return;
}

Assistant:

TEST(ConfigTest, write_object) {
	std::filesystem::path file_path = make_tmp_file("write_object.test", "some_data");
	config::write_object(object{}, file_path);

	EXPECT_EQ(config::read_object(file_path).get<std::u8string>(), u8"serialize_result");
}